

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

weak_ordering compareThreeWay(QUrl *lhs,QUrl *rhs)

{
  int iVar1;
  QUrlPrivate *this;
  bool bVar2;
  bool bVar3;
  CompareUnderlyingType CVar4;
  byte bVar5;
  int iVar6;
  CompareUnderlyingType CVar7;
  
  this = lhs->d;
  if (this == (QUrlPrivate *)0x0) {
    bVar2 = true;
  }
  else {
    if (rhs->d != (QUrlPrivate *)0x0) {
      iVar6 = QString::compare(&this->scheme,&rhs->d->scheme,CaseSensitive);
      if ((((iVar6 == 0) &&
           (iVar6 = QString::compare(&lhs->d->userName,&rhs->d->userName,CaseSensitive), iVar6 == 0)
           ) && (iVar6 = QString::compare(&lhs->d->password,&rhs->d->password,CaseSensitive),
                iVar6 == 0)) &&
         (iVar6 = QString::compare(&lhs->d->host,&rhs->d->host,CaseSensitive), iVar6 == 0)) {
        iVar6 = rhs->d->port;
        iVar1 = lhs->d->port;
        if (iVar1 != iVar6) {
          bVar5 = -(iVar1 < iVar6);
          goto LAB_00240a00;
        }
        iVar6 = QString::compare(&lhs->d->path,&rhs->d->path,CaseSensitive);
        if (iVar6 == 0) {
          bVar5 = rhs->d->sectionIsPresent;
          if ((lhs->d->sectionIsPresent & 0x40) >> 6 != (bVar5 & 0x40) >> 6) {
            bVar5 = -((bVar5 >> 6 & 1) != 0);
            goto LAB_00240a00;
          }
          iVar6 = QString::compare(&lhs->d->query,&rhs->d->query,CaseSensitive);
          if (iVar6 == 0) {
            bVar5 = rhs->d->sectionIsPresent;
            if (-1 < (char)(lhs->d->sectionIsPresent ^ bVar5)) {
              iVar6 = QString::compare(&lhs->d->fragment,&rhs->d->fragment,CaseSensitive);
              if (iVar6 != 0) {
                return (weak_ordering)((byte)(iVar6 >> 0x1f) | 1);
              }
              return (weak_ordering)'\0';
            }
            bVar5 = (char)bVar5 >> 7;
            goto LAB_00240a00;
          }
        }
      }
      bVar5 = (byte)(iVar6 >> 0x1f);
LAB_00240a00:
      return (weak_ordering)(bVar5 | 1);
    }
    bVar2 = QUrlPrivate::isEmpty(this);
  }
  if (rhs->d != (QUrlPrivate *)0x0) {
    bVar3 = QUrlPrivate::isEmpty(rhs->d);
    CVar7 = -1;
    if (!bVar3) goto LAB_00240a25;
  }
  CVar7 = '\0';
LAB_00240a25:
  CVar4 = '\x01';
  if (bVar2 != false) {
    CVar4 = CVar7;
  }
  return (weak_ordering)CVar4;
}

Assistant:

Qt::weak_ordering compareThreeWay(const QUrl &lhs, const QUrl &rhs)
{
    if (!lhs.d || !rhs.d) {
        bool thisIsEmpty = !lhs.d || lhs.d->isEmpty();
        bool thatIsEmpty = !rhs.d || rhs.d->isEmpty();

        // sort an empty URL first
        if (thisIsEmpty) {
            if (!thatIsEmpty)
                return Qt::weak_ordering::less;
            else
                return Qt::weak_ordering::equivalent;
        } else {
            return Qt::weak_ordering::greater;
        }
    }

    int cmp;
    cmp = lhs.d->scheme.compare(rhs.d->scheme);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->userName.compare(rhs.d->userName);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->password.compare(rhs.d->password);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->host.compare(rhs.d->host);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->port != rhs.d->port)
        return Qt::compareThreeWay(lhs.d->port, rhs.d->port);

    cmp = lhs.d->path.compare(rhs.d->path);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->hasQuery() != rhs.d->hasQuery())
        return rhs.d->hasQuery() ? Qt::weak_ordering::less : Qt::weak_ordering::greater;

    cmp = lhs.d->query.compare(rhs.d->query);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->hasFragment() != rhs.d->hasFragment())
        return rhs.d->hasFragment() ? Qt::weak_ordering::less : Qt::weak_ordering::greater;

    cmp = lhs.d->fragment.compare(rhs.d->fragment);
    return Qt::compareThreeWay(cmp, 0);
}